

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O3

int Bdc_ManNodeVerify(Bdc_Man_t *p,Bdc_Isf_t *pIsf,Bdc_Fun_t *pFunc)

{
  uint *puTruth;
  uint *puVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  puTruth = p->puTemp1;
  if (((ulong)pFunc & 1) == 0) {
    uVar7 = 1 << ((char)p->nVars - 5U & 0x1f);
    if (p->nVars < 6) {
      uVar7 = 1;
    }
    if ((int)uVar7 < 1) {
code_r0x00530ddc:
      uVar5 = (ulong)(uint)(1 << ((char)p->nVars - 5U & 0x1f));
      uVar6 = uVar5;
      if (p->nVars < 6) {
        uVar5 = 1;
        uVar6 = uVar5;
      }
      while (0 < (int)uVar5) {
        lVar2 = uVar5 - 1;
        lVar3 = uVar5 - 1;
        uVar5 = uVar5 - 1;
        if ((pIsf->puOn[lVar3] & ~puTruth[lVar2]) != 0) {
          return 0;
        }
      }
      do {
        if ((int)uVar6 < 1) {
          return 1;
        }
        lVar2 = uVar6 - 1;
        lVar3 = uVar6 - 1;
        uVar6 = uVar6 - 1;
      } while ((puTruth[lVar3] & pIsf->puOff[lVar2]) == 0);
      return 0;
    }
    puVar1 = pFunc->puFunc;
    uVar6 = (ulong)uVar7 + 1;
    do {
      puTruth[uVar6 - 2] = puVar1[uVar6 - 2];
      uVar6 = uVar6 - 1;
    } while (1 < uVar6);
  }
  else {
    uVar7 = 1 << ((char)p->nVars - 5U & 0x1f);
    if (p->nVars < 6) {
      uVar7 = 1;
    }
    if ((int)uVar7 < 1) goto code_r0x00530ddc;
    lVar2 = *(long *)(((ulong)pFunc & 0xfffffffffffffffe) + 0x20);
    uVar6 = (ulong)uVar7 + 1;
    do {
      puTruth[uVar6 - 2] = ~*(uint *)(lVar2 + -8 + uVar6 * 4);
      uVar6 = uVar6 - 1;
    } while (1 < uVar6);
  }
  iVar4 = Bdc_TableCheckContainment(p,pIsf,puTruth);
  return iVar4;
}

Assistant:

int Bdc_ManNodeVerify( Bdc_Man_t * p, Bdc_Isf_t * pIsf, Bdc_Fun_t * pFunc )
{
    unsigned * puTruth = p->puTemp1;
    if ( Bdc_IsComplement(pFunc) )
        Kit_TruthNot( puTruth, Bdc_Regular(pFunc)->puFunc, p->nVars );
    else
        Kit_TruthCopy( puTruth, pFunc->puFunc, p->nVars );
    return Bdc_TableCheckContainment( p, pIsf, puTruth );
}